

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_wrap.hpp
# Opt level: O1

JSON * chaiscript::json_wrap::to_json_object(JSON *__return_storage_ptr__,Boxed_Value *t_bv)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  *__x;
  _Base_ptr p_Var2;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> v;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  m;
  undefined1 local_c0 [32];
  __index_type local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  local_88;
  anon_class_8_1_8991fb9c local_58 [5];
  
  __x = &boxed_cast<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>const&>
                   (t_bv,(Type_Conversions_State *)0x0)->_M_t;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::_Rb_tree(&local_88,__x);
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->internal).d.
           super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
           .
           super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
   + 8) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->internal).d.
           super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
           .
           super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
   + 0x10) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->internal).d.
           super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
           .
           super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
   + 0x18) = 0;
  local_c0._24_8_ = 0;
  local_c0._8_16_ = (undefined1  [16])0x0;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->internal).d.
           super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
           .
           super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
   + 0x20) = '\x01';
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON>_>_>
             *)(local_c0 + 8));
  p_Var1 = &local_88._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_88._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    p_Var2 = local_88._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      to_json_object((JSON *)local_c0,(Boxed_Value *)(p_Var2 + 2));
      local_58[0].this =
           (_Move_assign_base<false,_std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
            *)json::JSON::operator[](__return_storage_ptr__,(string *)(p_Var2 + 1));
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>_&>
        ::_S_vtable._M_arr[(long)(char)local_a0 + 1]._M_data)
                (local_58,(variant<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
                           *)local_c0);
      std::__detail::__variant::
      _Variant_storage<false,_std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
      ::~_Variant_storage((_Variant_storage<false,_std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
                           *)local_c0);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::~_Rb_tree(&local_88);
  return __return_storage_ptr__;
}

Assistant:

static json::JSON to_json_object(const Boxed_Value &t_bv) {
      try {
        const std::map<std::string, Boxed_Value> m = chaiscript::boxed_cast<const std::map<std::string, Boxed_Value> &>(t_bv);

        json::JSON obj(json::JSON::Class::Object);
        for (const auto &o : m) {
          obj[o.first] = to_json_object(o.second);
        }
        return obj;
      } catch (const chaiscript::exception::bad_boxed_cast &) {
        // not a map
      }

      try {
        const std::vector<Boxed_Value> v = chaiscript::boxed_cast<const std::vector<Boxed_Value> &>(t_bv);

        json::JSON obj(json::JSON::Class::Array);
        for (size_t i = 0; i < v.size(); ++i) {
          obj[i] = to_json_object(v[i]);
        }
        return obj;
      } catch (const chaiscript::exception::bad_boxed_cast &) {
        // not a vector
      }

      try {
        Boxed_Number bn(t_bv);
        if (Boxed_Number::is_floating_point(t_bv)) {
          return json::JSON(bn.get_as<double>());
        } else {
          return json::JSON(bn.get_as<std::int64_t>());
        }
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
        // not a number
      }

      try {
        return json::JSON(boxed_cast<bool>(t_bv));
      } catch (const chaiscript::exception::bad_boxed_cast &) {
        // not a bool
      }

      try {
        return json::JSON(boxed_cast<std::string>(t_bv));
      } catch (const chaiscript::exception::bad_boxed_cast &) {
        // not a string
      }

      try {
        const chaiscript::dispatch::Dynamic_Object &o = boxed_cast<const dispatch::Dynamic_Object &>(t_bv);

        json::JSON obj(json::JSON::Class::Object);
        for (const auto &attr : o.get_attrs()) {
          obj[attr.first] = to_json_object(attr.second);
        }
        return obj;
      } catch (const chaiscript::exception::bad_boxed_cast &) {
        // not a dynamic object
      }

      if (t_bv.is_null())
        return json::JSON(); // a null value

      throw std::runtime_error("Unknown object type to convert to JSON");
    }